

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flip_book_group.cpp
# Opt level: O0

void flip_book_copy(Am_Object *self)

{
  undefined1 auVar1 [16];
  Am_Object_Data *pAVar2;
  Am_Object AVar3;
  bool bVar4;
  unsigned_short uVar5;
  uint uVar6;
  Am_Object_Demon *pAVar7;
  Am_Value *pAVar8;
  Am_Wrapper *pAVar9;
  ulong uVar10;
  ulong uVar11;
  ulong *puVar12;
  ulong uVar13;
  Am_Object_Data *this;
  Am_Object in_stack_fffffffffffffe88;
  Am_Object_Data *local_100;
  Am_Object local_a0;
  Am_Object current_component;
  int local_8c;
  int i;
  Am_Object part;
  Am_Object *part_map;
  int parts_length;
  undefined1 local_68 [8];
  Am_Part_Iterator parts;
  Am_Value_List new_components;
  Am_Value_List components;
  Am_Demon_Set local_20;
  Am_Object_Demon *local_18;
  Am_Object_Demon *copy_demon;
  Am_Object *self_local;
  
  copy_demon = (Am_Object_Demon *)self;
  Am_Object_Advanced::Get_Demons((Am_Object_Advanced *)&local_20);
  pAVar7 = Am_Demon_Set::Get_Object_Demon(&local_20,Am_COPY_OBJ);
  Am_Demon_Set::~Am_Demon_Set(&local_20);
  local_18 = pAVar7;
  Am_Object::Am_Object((Am_Object *)&components.item,self);
  (*pAVar7)(in_stack_fffffffffffffe88);
  Am_Object::~Am_Object((Am_Object *)&components.item);
  Am_Value_List::Am_Value_List((Am_Value_List *)&new_components.item);
  pAVar8 = Am_Object::Get(self,0x83,0);
  Am_Value_List::operator=((Am_Value_List *)&new_components.item,pAVar8);
  Am_Value_List::Am_Value_List((Am_Value_List *)&parts.owner);
  Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffff90,self);
  Am_Part_Iterator::Am_Part_Iterator
            ((Am_Part_Iterator *)local_68,(Am_Object *)&stack0xffffffffffffff90);
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffff90);
  uVar5 = Am_Part_Iterator::Length((Am_Part_Iterator *)local_68);
  uVar6 = (uint)uVar5;
  bVar4 = Am_Value_List::Empty((Am_Value_List *)&new_components.item);
  if ((bVar4) || (uVar6 == 0)) {
    pAVar9 = Am_Value_List::operator_cast_to_Am_Wrapper_(&Am_No_Value_List);
    Am_Object::Set(self,0x83,pAVar9,0);
  }
  else {
    uVar10 = (ulong)(int)(uVar6 * 2);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar10;
    uVar11 = SUB168(auVar1 * ZEXT816(8),0);
    uVar13 = uVar11 + 8;
    if (0xfffffffffffffff7 < uVar11) {
      uVar13 = 0xffffffffffffffff;
    }
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar13 = 0xffffffffffffffff;
    }
    puVar12 = (ulong *)operator_new__(uVar13);
    *puVar12 = uVar10;
    part.data = (Am_Object_Data *)(puVar12 + 1);
    if (uVar10 != 0) {
      local_100 = part.data;
      do {
        Am_Object::Am_Object((Am_Object *)local_100);
        local_100 = (Am_Object_Data *)&(local_100->super_Am_Wrapper).refs;
      } while (local_100 !=
               (Am_Object_Data *)
               (&((part.data)->super_Am_Wrapper).super_Am_Registered_Type + uVar10));
    }
    Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffff78);
    local_8c = 0;
    Am_Part_Iterator::Start((Am_Part_Iterator *)local_68);
    while (bVar4 = Am_Part_Iterator::Last((Am_Part_Iterator *)local_68), ((bVar4 ^ 0xffU) & 1) != 0)
    {
      Am_Part_Iterator::Get((Am_Part_Iterator *)&current_component);
      Am_Object::operator=((Am_Object *)&stack0xffffffffffffff78,&current_component);
      Am_Object::~Am_Object(&current_component);
      Am_Object::operator=
                ((Am_Object *)
                 (&((part.data)->super_Am_Wrapper).super_Am_Registered_Type +
                 (int)(local_8c + uVar6)),(Am_Object *)&stack0xffffffffffffff78);
      pAVar8 = Am_Object::Get((Am_Object *)&stack0xffffffffffffff78,0xc,0);
      Am_Object::operator=
                ((Am_Object *)(&((part.data)->super_Am_Wrapper).super_Am_Registered_Type + local_8c)
                 ,pAVar8);
      local_8c = local_8c + 1;
      Am_Part_Iterator::Next((Am_Part_Iterator *)local_68);
    }
    Am_Object::Am_Object(&local_a0);
    Am_Value_List::Start((Am_Value_List *)&new_components.item);
    while (bVar4 = Am_Value_List::Last((Am_Value_List *)&new_components.item), AVar3 = part,
          ((bVar4 ^ 0xffU) & 1) != 0) {
      pAVar8 = Am_Value_List::Get((Am_Value_List *)&new_components.item);
      Am_Object::operator=(&local_a0,pAVar8);
      for (local_8c = 0; local_8c < (int)uVar6; local_8c = local_8c + 1) {
        bVar4 = Am_Object::operator==
                          (&local_a0,
                           (Am_Object *)
                           (&((part.data)->super_Am_Wrapper).super_Am_Registered_Type + local_8c));
        if (bVar4) {
          pAVar9 = Am_Object::operator_cast_to_Am_Wrapper_
                             ((Am_Object *)
                              (&((part.data)->super_Am_Wrapper).super_Am_Registered_Type +
                              (int)(local_8c + uVar6)));
          Am_Value_List::Add((Am_Value_List *)&parts.owner,pAVar9,Am_TAIL,true);
          break;
        }
      }
      Am_Value_List::Next((Am_Value_List *)&new_components.item);
    }
    if (part.data != (Am_Object_Data *)0x0) {
      pAVar2 = part.data + -1;
      this = (Am_Object_Data *)
             (&((part.data)->super_Am_Wrapper).super_Am_Registered_Type +
             *(long *)&part.data[-1].data.data_size);
      while (AVar3.data != this) {
        this = (Am_Object_Data *)&this[-1].data.data_size;
        Am_Object::~Am_Object((Am_Object *)this);
      }
      operator_delete__(&(pAVar2->data).data_size);
    }
    pAVar9 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)&parts.owner);
    Am_Object::Set(self,0x83,pAVar9,0);
    Am_Object::~Am_Object(&local_a0);
    Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffff78);
  }
  Am_Part_Iterator::~Am_Part_Iterator((Am_Part_Iterator *)local_68);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&parts.owner);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&new_components.item);
  return;
}

Assistant:

static void
flip_book_copy(Am_Object self)
{
  Am_Object_Demon *copy_demon = ((Am_Object_Advanced &)Am_Aggregate)
                                    .Get_Demons()
                                    .Get_Object_Demon(Am_COPY_OBJ);
  copy_demon(self);

  Am_Value_List components;
  components = self.Get(Am_FLIP_BOOK_PARTS);
  Am_Value_List new_components;
  Am_Part_Iterator parts = self;
  int parts_length = parts.Length();
  if (components.Empty() || (parts_length == 0)) {
    self.Set(Am_FLIP_BOOK_PARTS, Am_No_Value_List);
    return;
  }
  Am_Object *part_map = new Am_Object[parts_length * 2];
  Am_Object part;
  int i;
  for (i = 0, parts.Start(); !parts.Last(); ++i, parts.Next()) {
    part = parts.Get();
    part_map[i + parts_length] = part;
    part_map[i] = part.Get(Am_SOURCE_OF_COPY);
  }
  Am_Object current_component;
  for (components.Start(); !components.Last(); components.Next()) {
    current_component = components.Get();
    for (i = 0; i < parts_length; ++i)
      if (current_component == part_map[i]) {
        new_components.Add(part_map[i + parts_length]);
        break;
      }
  }
  delete[] part_map;
  self.Set(Am_FLIP_BOOK_PARTS, new_components);
}